

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O3

int tool_write_headers(HdrCbData *hdrcbdata,FILE *stream)

{
  char *__s;
  size_t __n;
  size_t sVar1;
  int iVar2;
  curl_slist *pcVar3;
  
  pcVar3 = hdrcbdata->headlist;
  if (pcVar3 == (curl_slist *)0x0) {
    pcVar3 = (curl_slist *)0x0;
    iVar2 = 0;
  }
  else {
    do {
      __s = pcVar3->data;
      __n = strlen(__s);
      sVar1 = fwrite(__s,1,__n,(FILE *)stream);
      if (__n != sVar1) {
        iVar2 = 1;
        goto LAB_0010b1d5;
      }
      pcVar3 = pcVar3->next;
    } while (pcVar3 != (curl_slist *)0x0);
    iVar2 = 0;
LAB_0010b1d5:
    pcVar3 = hdrcbdata->headlist;
  }
  curl_slist_free_all(pcVar3);
  hdrcbdata->headlist = (curl_slist *)0x0;
  return iVar2;
}

Assistant:

int tool_write_headers(struct HdrCbData *hdrcbdata, FILE *stream)
{
  struct curl_slist *h = hdrcbdata->headlist;
  int rc = 1;
  while(h) {
    /* not "handled", just show it */
    size_t len = strlen(h->data);
    if(len != fwrite(h->data, 1, len, stream))
      goto fail;
    h = h->next;
  }
  rc = 0; /* success */
fail:
  curl_slist_free_all(hdrcbdata->headlist);
  hdrcbdata->headlist = NULL;
  return rc;
}